

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O1

Sym_Man_t * Sym_ManStart(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Sym_Man_t *__s;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  void **__s_00;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Extra_BitMat_t *pEVar8;
  uint *puVar9;
  Vec_Vec_t *pVVar10;
  undefined8 *puVar11;
  void *pvVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  
  __s = (Sym_Man_t *)malloc(0xf8);
  ppvVar4 = (void **)0x0;
  memset(__s,0,0xf8);
  __s->pNtk = pNtk;
  pVVar3 = Abc_NtkDfs(pNtk,0);
  __s->vNodes = pVVar3;
  uVar1 = pNtk->vCis->nSize;
  __s->nInputs = uVar1;
  uVar13 = pNtk->vCos->nSize;
  lVar20 = (long)(int)uVar13;
  iVar21 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  __s->nOutputs = uVar13;
  __s->nSimWords = iVar21;
  pVVar3 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,iVar21,0);
  __s->vSim = pVVar3;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  uVar22 = 8;
  if (6 < uVar13 - 1) {
    uVar22 = uVar13;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar22;
  if (uVar22 != 0) {
    ppvVar4 = (void **)malloc((long)(int)uVar22 * 8);
  }
  pVVar3->pArray = ppvVar4;
  pVVar3->nSize = uVar13;
  __s_00 = (void **)0x0;
  memset(ppvVar4,0,lVar20 * 8);
  __s->vMatrSymms = pVVar3;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nSize = 0;
  pVVar5->nCap = uVar22;
  if (uVar22 != 0) {
    __s_00 = (void **)malloc((long)(int)uVar22 << 3);
  }
  pVVar5->pArray = __s_00;
  pVVar5->nSize = uVar13;
  piVar7 = (int *)0x0;
  memset(__s_00,0,lVar20 * 8);
  __s->vMatrNonSymms = pVVar5;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar22 = 0x10;
  if (0xe < uVar13 - 1) {
    uVar22 = uVar13;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar22;
  lVar14 = (long)(int)uVar22;
  if (uVar22 != 0) {
    piVar7 = (int *)malloc(lVar14 * 4);
  }
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar13;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,lVar20 * 4);
  }
  __s->vPairsTotal = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar22;
  if (uVar22 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(lVar14 * 4);
  }
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar13;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,lVar20 * 4);
  }
  __s->vPairsSym = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar22;
  if (uVar22 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(lVar14 << 2);
  }
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar13;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,lVar20 << 2);
  }
  __s->vPairsNonSym = pVVar6;
  if (0 < (int)uVar13) {
    uVar16 = 0;
    do {
      pEVar8 = Extra_BitMatrixStart(uVar1);
      pVVar3->pArray[uVar16] = pEVar8;
      pEVar8 = Extra_BitMatrixStart(uVar1);
      pVVar5->pArray[uVar16] = pEVar8;
      uVar16 = uVar16 + 1;
    } while (uVar13 != uVar16);
  }
  sVar17 = (long)iVar21 << 2;
  puVar9 = (uint *)malloc(sVar17);
  __s->uPatRand = puVar9;
  puVar9 = (uint *)malloc(sVar17);
  __s->uPatCol = puVar9;
  puVar9 = (uint *)malloc(sVar17);
  __s->uPatRow = puVar9;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = 100;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,400);
  }
  __s->vVarsU = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = 100;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,400);
  }
  __s->vVarsV = pVVar6;
  pVVar3 = Sim_ComputeFunSupp(pNtk,fVerbose);
  __s->vSuppFun = pVVar3;
  uVar1 = __s->nOutputs;
  pVVar10 = (Vec_Vec_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar1 - 1) {
    uVar13 = uVar1;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = uVar13;
  if (uVar13 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)(int)uVar13 << 3);
  }
  pVVar10->pArray = ppvVar4;
  if (0 < (int)uVar1) {
    uVar16 = 0;
    do {
      puVar11 = (undefined8 *)malloc(0x10);
      *puVar11 = 0;
      puVar11[1] = 0;
      ppvVar4[uVar16] = puVar11;
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  pVVar10->nSize = uVar1;
  __s->vSupports = pVVar10;
  if (0 < (int)uVar1) {
    uVar13 = __s->nInputs;
    uVar16 = 0;
    do {
      if (0 < (int)uVar13) {
        sVar17 = uVar16 * 8 + 8;
        uVar22 = 0;
        do {
          if ((*(uint *)((long)pVVar3->pArray[uVar16] + (ulong)(uVar22 >> 5) * 4) >> (uVar22 & 0x1f)
              & 1) != 0) {
            if ((long)pVVar10->nSize <= (long)uVar16) {
              iVar21 = (int)(uVar16 + 1);
              if ((long)pVVar10->nCap <= (long)uVar16) {
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(sVar17);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar10->pArray,sVar17);
                }
                pVVar10->pArray = ppvVar4;
                pVVar10->nCap = iVar21;
              }
              uVar18 = (ulong)pVVar10->nSize;
              if ((long)uVar18 <= (long)uVar16) {
                do {
                  uVar19 = uVar18 + 1;
                  puVar11 = (undefined8 *)malloc(0x10);
                  *puVar11 = 0;
                  puVar11[1] = 0;
                  pVVar10->pArray[uVar18] = puVar11;
                  uVar18 = uVar19;
                } while (uVar16 + 1 != (uVar19 & 0xffffffff));
              }
              pVVar10->nSize = iVar21;
            }
            if ((long)pVVar10->nSize <= (long)uVar16) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                            ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
            }
            puVar9 = (uint *)pVVar10->pArray[uVar16];
            uVar2 = *puVar9;
            if (puVar9[1] == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (*(void **)(puVar9 + 2) == (void *)0x0) {
                  pvVar12 = malloc(0x40);
                }
                else {
                  pvVar12 = realloc(*(void **)(puVar9 + 2),0x40);
                }
                *(void **)(puVar9 + 2) = pvVar12;
                uVar15 = 0x10;
              }
              else {
                uVar15 = uVar2 * 2;
                if ((int)uVar15 <= (int)uVar2) goto LAB_008c4fee;
                if (*(void **)(puVar9 + 2) == (void *)0x0) {
                  pvVar12 = malloc((ulong)uVar2 << 3);
                }
                else {
                  pvVar12 = realloc(*(void **)(puVar9 + 2),(ulong)uVar2 << 3);
                }
                *(void **)(puVar9 + 2) = pvVar12;
              }
              if (pvVar12 == (void *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              *puVar9 = uVar15;
            }
LAB_008c4fee:
            uVar2 = puVar9[1];
            puVar9[1] = uVar2 + 1;
            *(uint *)(*(long *)(puVar9 + 2) + (long)(int)uVar2 * 4) = uVar22;
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar13);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar1);
  }
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the simulation manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sym_Man_t * Sym_ManStart( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sym_Man_t * p;
    int i, v; 
    // start the manager
    p = ABC_ALLOC( Sym_Man_t, 1 );
    memset( p, 0, sizeof(Sym_Man_t) );
    p->pNtk = pNtk;
    p->vNodes     = Abc_NtkDfs( pNtk, 0 );
    p->nInputs    = Abc_NtkCiNum(p->pNtk);
    p->nOutputs   = Abc_NtkCoNum(p->pNtk);
    // internal simulation information
    p->nSimWords  = SIM_NUM_WORDS(p->nInputs);
    p->vSim       = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
    // symmetry info for each output
    p->vMatrSymms    = Vec_PtrStart( p->nOutputs );
    p->vMatrNonSymms = Vec_PtrStart( p->nOutputs );
    p->vPairsTotal   = Vec_IntStart( p->nOutputs );
    p->vPairsSym     = Vec_IntStart( p->nOutputs );
    p->vPairsNonSym  = Vec_IntStart( p->nOutputs );
    for ( i = 0; i < p->nOutputs; i++ )
    {
        p->vMatrSymms->pArray[i]    = Extra_BitMatrixStart( p->nInputs );
        p->vMatrNonSymms->pArray[i] = Extra_BitMatrixStart( p->nInputs );
    }
    // temporary patterns
    p->uPatRand = ABC_ALLOC( unsigned, p->nSimWords );
    p->uPatCol  = ABC_ALLOC( unsigned, p->nSimWords );
    p->uPatRow  = ABC_ALLOC( unsigned, p->nSimWords );
    p->vVarsU   = Vec_IntStart( 100 );
    p->vVarsV   = Vec_IntStart( 100 );
    // compute supports
    p->vSuppFun  = Sim_ComputeFunSupp( pNtk, fVerbose );
    p->vSupports = Vec_VecStart( p->nOutputs );
    for ( i = 0; i < p->nOutputs; i++ )
        for ( v = 0; v < p->nInputs; v++ )
            if ( Sim_SuppFunHasVar( p->vSuppFun, i, v ) )
                Vec_VecPushInt( p->vSupports, i, v );
    return p;
}